

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O1

void __thiscall ConductorBRDF::sample_f(ConductorBRDF *this)

{
  vec3f *in_RCX;
  vec3f *in_RDX;
  Color *in_RSI;
  float *in_R8;
  Sampler *in_R9;
  
  sample_f((ConductorBRDF *)
           ((long)&(this->super_BRDF)._vptr_BRDF + (long)(this->super_BRDF)._vptr_BRDF[-4]),in_RSI,
           in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		wi = vec3f(-wo.x, -wo.y, wo.z);
		float cos = fabs(wo.z);
		pdf = 1;
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		return 0.5 / cos * (r1 + r2) * albedo;
	}